

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O3

bool __thiscall CaptureSummary::Merge(CaptureSummary *this,size_t nb_files,char **file_name)

{
  undefined1 auVar1 [16];
  bool bVar2;
  CaptureSummary **cs;
  ulong *puVar3;
  ulong uVar4;
  ulong *puVar5;
  CaptureSummary *pCVar6;
  ulong *puVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  uVar4 = nb_files + 1;
  cs = (CaptureSummary **)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
  puVar3 = (ulong *)operator_new__(-(ulong)(uVar4 >> 0x3b != 0) | uVar4 * 0x20 | 8);
  uVar4 = nb_files + 1;
  *puVar3 = uVar4;
  if (uVar4 == 0) {
LAB_00159a61:
    auVar1 = _DAT_00181d40;
    lVar9 = nb_files - 1;
    auVar11._8_4_ = (int)lVar9;
    auVar11._0_8_ = lVar9;
    auVar11._12_4_ = (int)((ulong)lVar9 >> 0x20);
    pCVar6 = (CaptureSummary *)(puVar3 + 5);
    uVar8 = 0;
    auVar11 = auVar11 ^ _DAT_00181d40;
    auVar12 = _DAT_00181d30;
    do {
      auVar13 = auVar12 ^ auVar1;
      if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                  auVar11._4_4_ < auVar13._4_4_) & 1)) {
        cs[uVar8] = pCVar6 + -1;
      }
      if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
          auVar13._12_4_ <= auVar11._12_4_) {
        cs[uVar8 + 1] = pCVar6;
      }
      uVar8 = uVar8 + 2;
      lVar9 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar9 + 2;
      pCVar6 = pCVar6 + 2;
    } while ((uVar4 & 0xfffffffffffffffe) != uVar8);
    uVar4 = 1;
    do {
      bVar2 = Load(cs[uVar4 - 1],file_name[uVar4 - 1]);
      if (!bVar2) break;
      bVar10 = uVar4 < nb_files;
      uVar4 = uVar4 + 1;
    } while (bVar10);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_00159b34;
    }
  }
  else {
    puVar5 = puVar3 + 1;
    puVar7 = puVar5 + uVar4 * 4;
    do {
      *(undefined4 *)puVar5 = 0xcd;
      *(undefined1 (*) [16])(puVar5 + 1) = (undefined1  [16])0x0;
      puVar5[3] = 0;
      puVar5 = puVar5 + 4;
    } while (puVar5 != puVar7);
    if (nb_files != 0) goto LAB_00159a61;
  }
  bVar2 = Merge(this,nb_files,cs);
LAB_00159b34:
  if (*puVar3 != 0) {
    lVar9 = *puVar3 << 5;
    do {
      ~CaptureSummary((CaptureSummary *)((long)puVar3 + lVar9 + -0x18));
      lVar9 = lVar9 + -0x20;
    } while (lVar9 != 0);
  }
  operator_delete__(puVar3);
  operator_delete__(cs);
  return bVar2;
}

Assistant:

bool CaptureSummary::Merge(size_t nb_files, char const ** file_name)
{
    CaptureSummary ** list = new  CaptureSummary*[nb_files + 1];
    CaptureSummary * baselist = new  CaptureSummary[nb_files + 1];

    bool ret = list != NULL && baselist != NULL;

    if (ret)
    {
        for (size_t i = 0; ret && i < nb_files; i++)
        {
            list[i] = &baselist[i];
        }
    }

    for (size_t i=0; ret && i < nb_files; i++)
    {
        ret = list[i]->Load(file_name[i]);
    }

    if (ret)
    {
        ret = Merge(nb_files, list);
    }

    if (baselist != NULL)
    {
        delete[] baselist;
    }

    if (list != NULL)
    {
        delete[] list;
    }

    return ret;
}